

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionZ.cpp
# Opt level: O0

void __thiscall OpenMD::PositionZ::process(PositionZ *this)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  SnapshotManager *pSVar5;
  Snapshot *pSVar6;
  double *pdVar7;
  reference pvVar8;
  mapped_type_conflict *pmVar9;
  size_type sVar10;
  long *in_RDI;
  RealType flucCount;
  uint index;
  int binNo_1;
  Vector3d pos_2;
  RealType halfBoxZ__1;
  Mat3x3d hmat_1;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> countInBin;
  int istep_1;
  int binNo;
  Vector3d pos_1;
  Vector3d pos;
  RealType halfBoxZ_;
  Mat3x3d hmat;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int ii;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffeb18;
  DumpReader *in_stack_ffffffffffffeb20;
  DumpReader *in_stack_ffffffffffffeb28;
  SelectionManager *in_stack_ffffffffffffeb30;
  SelectionEvaluator *in_stack_ffffffffffffeb58;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_ffffffffffffeb60;
  StuntDouble *in_stack_ffffffffffffeb98;
  Snapshot *in_stack_ffffffffffffeba0;
  double *in_stack_ffffffffffffeba8;
  DumpReader *in_stack_ffffffffffffebb0;
  uint local_13c8;
  Vector<double,_3U> local_13c0;
  double local_13a8;
  RectMatrix<double,_3U,_3U> local_13a0;
  int local_1328;
  int local_1324;
  Vector<double,_3U> local_1320 [3];
  double local_12d8;
  string *in_stack_ffffffffffffed70;
  undefined4 in_stack_ffffffffffffed78;
  int iVar11;
  undefined4 in_stack_ffffffffffffed7c;
  DumpReader *in_stack_ffffffffffffed80;
  StuntDouble *local_10;
  
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar2 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1ff6f0);
  DumpReader::DumpReader
            (in_stack_ffffffffffffed80,
             (SimInfo *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
             in_stack_ffffffffffffed70);
  iVar4 = DumpReader::getNFrames(in_stack_ffffffffffffeb20);
  *(int *)(in_RDI + 0x1a) = iVar4 / (int)in_RDI[6];
  for (iVar11 = 0; iVar11 < iVar4; iVar11 = (int)in_RDI[6] + iVar11) {
    DumpReader::readFrame(in_stack_ffffffffffffebb0,(int)((ulong)in_stack_ffffffffffffeba8 >> 0x20))
    ;
    pSVar5 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar6 = SnapshotManager::getCurrentSnapshot(pSVar5);
    in_RDI[0x19] = (long)pSVar6;
    Snapshot::getHmat(in_stack_ffffffffffffeb18);
    RectMatrix<double,_3U,_3U>::operator()
              ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffed30,*(uint *)(in_RDI + 0xef),
               *(uint *)(in_RDI + 0xef));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeb30,
               (value_type_conflict2 *)in_stack_ffffffffffffeb28);
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffed30,
                        *(uint *)(in_RDI + 0xef),*(uint *)(in_RDI + 0xef));
    local_12d8 = *pdVar7 * 0.5;
    bVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
    if (bVar3) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffeb58);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffeb30,(SelectionSet *)in_stack_ffffffffffffeb28);
      SelectionSet::~SelectionSet((SelectionSet *)0x1ff90f);
    }
    local_10 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffeb30,(int *)in_stack_ffffffffffffeb28);
    while (local_10 != (StuntDouble *)0x0) {
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffeb28);
      if (bVar2) {
        Snapshot::wrapVector(in_stack_ffffffffffffeba0,(Vector3d *)in_stack_ffffffffffffeb98);
      }
      StuntDouble::setPos((StuntDouble *)in_stack_ffffffffffffeb30,
                          (Vector3d *)in_stack_ffffffffffffeb28);
      local_10 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffeb30,(int *)in_stack_ffffffffffffeb28);
    }
    local_10 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffeb30,(int *)in_stack_ffffffffffffeb28);
    while (local_10 != (StuntDouble *)0x0) {
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffeb28);
      dVar1 = local_12d8;
      in_stack_ffffffffffffebb0 = (DumpReader *)(double)*(uint *)((long)in_RDI + 0x34);
      pdVar7 = Vector<double,_3U>::operator[](local_1320,*(uint *)(in_RDI + 0xef));
      in_stack_ffffffffffffeba0 =
           (Snapshot *)((double)in_stack_ffffffffffffebb0 * (dVar1 + *pdVar7));
      in_stack_ffffffffffffeba8 =
           RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffed30,
                      *(uint *)(in_RDI + 0xef),*(uint *)(in_RDI + 0xef));
      local_1324 = (int)((double)in_stack_ffffffffffffeba0 / *in_stack_ffffffffffffeba8);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe3),
                          (long)local_1324);
      *pvVar8 = *pvVar8 + 1.0;
      in_stack_ffffffffffffeb98 =
           SelectionManager::nextSelected
                     (in_stack_ffffffffffffeb30,(int *)in_stack_ffffffffffffeb28);
      local_10 = in_stack_ffffffffffffeb98;
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1ffbd1);
  }
  for (local_1328 = 0; local_1328 < iVar4; local_1328 = (int)in_RDI[6] + local_1328) {
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x1ffc2d);
    DumpReader::readFrame(in_stack_ffffffffffffebb0,(int)((ulong)in_stack_ffffffffffffeba8 >> 0x20))
    ;
    pSVar5 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar6 = SnapshotManager::getCurrentSnapshot(pSVar5);
    in_RDI[0x19] = (long)pSVar6;
    Snapshot::getHmat(in_stack_ffffffffffffeb18);
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       (&local_13a0,*(uint *)(in_RDI + 0xef),*(uint *)(in_RDI + 0xef));
    local_13a8 = *pdVar7 * 0.5;
    local_10 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffeb30,(int *)in_stack_ffffffffffffeb28);
    while (local_10 != (StuntDouble *)0x0) {
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffeb28);
      in_stack_ffffffffffffeb60 =
           (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
           (double)*(uint *)((long)in_RDI + 0x34);
      Vector<double,_3U>::operator[](&local_13c0,*(uint *)(in_RDI + 0xef));
      in_stack_ffffffffffffeb58 =
           (SelectionEvaluator *)
           RectMatrix<double,_3U,_3U>::operator()
                     (&local_13a0,*(uint *)(in_RDI + 0xef),*(uint *)(in_RDI + 0xef));
      pmVar9 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](in_stack_ffffffffffffeb60,(key_type *)in_stack_ffffffffffffeb58);
      *pmVar9 = *pmVar9 + 1.0;
      local_10 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffeb30,(int *)in_stack_ffffffffffffeb28);
    }
    for (local_13c8 = 0;
        sVar10 = std::vector<double,_std::allocator<double>_>::size
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe6)),
        local_13c8 < sVar10; local_13c8 = local_13c8 + 1) {
      in_stack_ffffffffffffeb30 =
           (SelectionManager *)
           std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](in_stack_ffffffffffffeb60,(key_type *)in_stack_ffffffffffffeb58);
      in_stack_ffffffffffffeb18 =
           (Snapshot *)
           (((_Vector_base<double,_std::allocator<double>_> *)&in_stack_ffffffffffffeb30->info_)->
           _M_impl).super__Vector_impl_data._M_start;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe3),
                          (ulong)local_13c8);
      in_stack_ffffffffffffeb20 =
           (DumpReader *)((double)in_stack_ffffffffffffeb18 - *pvVar8 / (double)(int)in_RDI[0x1a]);
      in_stack_ffffffffffffeb28 = in_stack_ffffffffffffeb20;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe6),
                          (ulong)local_13c8);
      *pvVar8 = (double)in_stack_ffffffffffffeb20 * (double)in_stack_ffffffffffffeb28 + *pvVar8;
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1fffa4);
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x1fffb1);
  }
  (**(code **)(*in_RDI + 0x20))();
  DumpReader::~DumpReader(in_stack_ffffffffffffeb20);
  return;
}

Assistant:

void PositionZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        sliceSDCount_[binNo]++;
      }

      // loop over the slices to calculate the charge
    }

    for (int istep = 0; istep < nFrames; istep += step_) {
      std::map<int, RealType> countInBin;

      reader.readFrame(istep);
      currentSnapshot_   = info_->getSnapshotManager()->getCurrentSnapshot();
      Mat3x3d hmat       = currentSnapshot_->getHmat();
      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        countInBin[binNo]++;
      }

      // loop over the slices to calculate the charge

      for (unsigned int index = 0; index < flucSliceSDCount_.size(); ++index) {
        RealType flucCount =
            (countInBin[index] - (sliceSDCount_[index] / nProcessed_));
        flucSliceSDCount_[index] += flucCount * flucCount;
      }
    }

    writePositionZ();
  }